

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O0

bool __thiscall
gmlc::containers::
BlockIterator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>const,32,std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>const*const*>
::checkEquivalence<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>**>
          (BlockIterator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>const,32,std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>const*const*>
           *this,unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **testv,
          int testoffset)

{
  bool local_21;
  int testoffset_local;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **testv_local;
  BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
  *this_local;
  
  if ((testv == *(unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> ***)this) ||
     ((((local_21 = false,
        testv != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0 &&
        (local_21 = false,
        *testv == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)0x0)) &&
       (local_21 = false, *(long *)this != 0)) && (local_21 = false, **(long **)this == 0)))) {
    local_21 = testoffset == *(int *)(this + 0x10);
  }
  return local_21;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }